

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qibusproxy.cpp
# Opt level: O0

void QIBusProxy::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMetaType QVar1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QDBusPendingCall *in_RDI;
  long in_FS_OFFSET;
  QIBusProxy *_t;
  QIBusEngineDesc _r_6;
  QDBusPendingCall _r_5;
  QDBusPendingCall _r_4;
  QDBusPendingReply<> _r_3;
  QDBusPendingReply<QDBusVariant> _r_2;
  QDBusPendingReply<> _r_1;
  QDBusPendingReply<QDBusObjectPath> _r;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  QIBusEngineDesc *in_stack_fffffffffffffda0;
  QIBusProxy *in_stack_fffffffffffffdb0;
  QIBusProxy *in_stack_fffffffffffffdb8;
  QDBusPendingCall *this;
  QMetaType local_218;
  QMetaTypeInterface *local_210;
  QMetaType local_208;
  QMetaType local_200;
  undefined1 local_1f8 [39];
  bool in_stack_fffffffffffffe2f;
  undefined8 local_50 [4];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      GlobalEngineChanged((QIBusProxy *)in_stack_fffffffffffffda0,
                          (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      break;
    case 1:
      local_10 = 0xaaaaaaaaaaaaaaaa;
      CreateInputContext((QIBusProxy *)(ulong)in_EDX,(QString *)in_RCX);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<QDBusObjectPath>::operator=
                  ((QDBusPendingReply<QDBusObjectPath> *)in_stack_fffffffffffffda0,
                   (QDBusPendingReply<QDBusObjectPath> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      QDBusPendingReply<QDBusObjectPath>::~QDBusPendingReply
                ((QDBusPendingReply<QDBusObjectPath> *)0x12ca9b);
      break;
    case 2:
      local_18 = 0xaaaaaaaaaaaaaaaa;
      Exit((QIBusProxy *)(ulong)in_EDX,in_stack_fffffffffffffe2f);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<>::operator=
                  ((QDBusPendingReply<> *)in_stack_fffffffffffffda0,
                   (QDBusPendingReply<> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0x12cafe);
      break;
    case 3:
      local_20 = 0xaaaaaaaaaaaaaaaa;
      Ping((QIBusProxy *)(ulong)in_EDX,(QDBusVariant *)in_RCX);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<QDBusVariant>::operator=
                  ((QDBusPendingReply<QDBusVariant> *)in_stack_fffffffffffffda0,
                   (QDBusPendingReply<QDBusVariant> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      QDBusPendingReply<QDBusVariant>::~QDBusPendingReply
                ((QDBusPendingReply<QDBusVariant> *)0x12cb5a);
      break;
    case 4:
      local_28 = 0xaaaaaaaaaaaaaaaa;
      RegisterComponent((QIBusProxy *)(ulong)in_EDX,(QDBusVariant *)in_RCX);
      if (*(long *)in_RCX != 0) {
        QDBusPendingReply<>::operator=
                  ((QDBusPendingReply<> *)in_stack_fffffffffffffda0,
                   (QDBusPendingReply<> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      QDBusPendingReply<>::~QDBusPendingReply((QDBusPendingReply<> *)0x12cbb6);
      break;
    case 5:
      local_30 = 0xaaaaaaaaaaaaaaaa;
      this = in_RDI;
      QString::QString((QString *)in_RDI,
                       (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      GetProperty((QIBusProxy *)this,(QString *)CONCAT44(in_ESI,in_EDX));
      QString::~QString((QString *)0x12cc11);
      if (*(long *)in_RCX != 0) {
        QDBusPendingCall::operator=
                  (in_RDI,(QDBusPendingCall *)
                          CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      }
      QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&local_30);
      break;
    case 6:
      local_50[0] = 0xaaaaaaaaaaaaaaaa;
      GlobalEngine(in_stack_fffffffffffffdb8);
      if (*(long *)in_RCX != 0) {
        QDBusPendingCall::operator=
                  ((QDBusPendingCall *)in_stack_fffffffffffffda0,
                   (QDBusPendingCall *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                  );
      }
      QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)local_50);
      break;
    case 7:
      memset(local_1f8,0xaa,0x1a8);
      getGlobalEngine(in_stack_fffffffffffffdb0);
      if (*(long *)in_RCX != 0) {
        QIBusEngineDesc::operator=
                  (in_stack_fffffffffffffda0,
                   (QIBusEngineDesc *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98))
        ;
      }
      QIBusEngineDesc::~QIBusEngineDesc(in_stack_fffffffffffffda0);
      break;
    case 8:
      globalEngineChanged((QIBusProxy *)in_stack_fffffffffffffda0,
                          (QString *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    }
  }
  if (in_ESI == 7) {
    if (in_EDX == 3) {
      if (**(int **)(in_RCX + 8) == 0) {
        local_210 = (QMetaTypeInterface *)QMetaType::fromType<QDBusVariant>();
        **(undefined8 **)in_RCX = local_210;
      }
      else {
        memset(&local_208,0,8);
        QMetaType::QMetaType(&local_208);
        **(undefined8 **)in_RCX = local_208.d_ptr;
      }
    }
    else if (in_EDX == 4) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar1 = QMetaType::fromType<QDBusVariant>();
        **(undefined8 **)in_RCX = QVar1.d_ptr;
      }
      else {
        memset(&local_218,0,8);
        QMetaType::QMetaType(&local_218);
        **(undefined8 **)in_RCX = local_218.d_ptr;
      }
    }
    else {
      memset(&local_200,0,8);
      QMetaType::QMetaType(&local_200);
      **(undefined8 **)in_RCX = local_200.d_ptr;
    }
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QIBusProxy::*)(QString_const&)>
              (in_RCX,(void **)GlobalEngineChanged,0,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIBusProxy::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QIBusProxy *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->GlobalEngineChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: { QDBusPendingReply<QDBusObjectPath> _r = _t->CreateInputContext((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->Exit((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QDBusVariant> _r = _t->Ping((*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QDBusVariant>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<> _r = _t->RegisterComponent((*reinterpret_cast< std::add_pointer_t<QDBusVariant>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusPendingCall _r = _t->GetProperty((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingCall*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingCall _r = _t->GlobalEngine();
            if (_a[0]) *reinterpret_cast< QDBusPendingCall*>(_a[0]) = std::move(_r); }  break;
        case 7: { QIBusEngineDesc _r = _t->getGlobalEngine();
            if (_a[0]) *reinterpret_cast< QIBusEngineDesc*>(_a[0]) = std::move(_r); }  break;
        case 8: _t->globalEngineChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusVariant >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QIBusProxy::*)(const QString & )>(_a, &QIBusProxy::GlobalEngineChanged, 0))
            return;
    }
}